

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O2

void av1_apply_temporal_filter_c
               (YV12_BUFFER_CONFIG *frame_to_filter,MACROBLOCKD *mbd,BLOCK_SIZE block_size,
               int mb_row,int mb_col,int num_planes,double *noise_levels,MV *subblock_mvs,
               int *subblock_mses,int q_factor,int filter_strength,int tf_wgt_calc_lvl,uint8_t *pred
               ,uint32_t *accum,uint16_t *count)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint8_t *puVar5;
  byte bVar6;
  byte bVar7;
  int subblock_idx;
  uint uVar8;
  long lVar9;
  void *__s;
  void *__s_00;
  ulong uVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  byte bVar16;
  ushort uVar17;
  int iVar18;
  undefined7 in_register_00000011;
  ulong uVar19;
  int iVar20;
  ushort uVar21;
  int iVar22;
  ulong uVar23;
  int ww;
  int iVar24;
  void *pvVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  int i;
  uint uVar30;
  uint uVar31;
  bool bVar32;
  double dVar33;
  double dVar34;
  undefined1 auVar35 [16];
  double dVar36;
  double dVar37;
  long local_160;
  double decay_factor [3];
  double d_factor [4];
  
  uVar14 = CONCAT71(in_register_00000011,block_size) & 0xffffffff;
  bVar2 = block_size_high[uVar14];
  uVar4 = frame_to_filter->flags;
  iVar13 = (frame_to_filter->field_2).field_0.y_crop_width;
  iVar22 = (frame_to_filter->field_3).field_0.y_crop_height;
  decay_factor[2] = 0.0;
  bVar3 = block_size_wide[uVar14];
  decay_factor[0] = 0.0;
  decay_factor[1] = 0.0;
  if (q_factor < 0x80) {
    dVar36 = (double)q_factor / 20.0;
    dVar36 = dVar36 * dVar36;
    dVar34 = 1.0;
    if (dVar36 <= 1.0) {
      dVar34 = dVar36;
    }
    dVar34 = (double)(-(ulong)(dVar36 < 1e-05) & 0x3ee4f8b588e368f1 |
                     ~-(ulong)(dVar36 < 1e-05) & (ulong)dVar34);
  }
  else {
    dVar34 = (double)q_factor * 0.015625;
    dVar34 = dVar34 * dVar34 * 0.5;
  }
  dVar37 = (double)filter_strength * 0.25 * (double)filter_strength * 0.25;
  dVar36 = 1.0;
  if (dVar37 <= 1.0) {
    dVar36 = dVar37;
  }
  uVar28 = 0;
  uVar14 = (ulong)(uint)num_planes;
  if (num_planes < 1) {
    uVar14 = uVar28;
  }
  for (; uVar14 != uVar28; uVar28 = uVar28 + 1) {
    dVar33 = log(noise_levels[uVar28] + noise_levels[uVar28] + 5.0);
    decay_factor[uVar28] =
         1.0 / ((dVar33 + 0.5) * dVar34 *
               (double)(-(ulong)(dVar37 < 1e-05) & 0x3ee4f8b588e368f1 |
                       ~-(ulong)(dVar37 < 1e-05) & (ulong)dVar36));
  }
  if (iVar22 < iVar13) {
    iVar13 = iVar22;
  }
  d_factor[2] = 0.0;
  d_factor[3] = 0.0;
  dVar34 = (double)iVar13 * 0.1;
  d_factor[0] = 0.0;
  d_factor[1] = 0.0;
  if (dVar34 <= 1.0) {
    dVar34 = 1.0;
  }
  for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
    auVar35 = pshuflw(ZEXT416((uint)subblock_mvs[lVar9]),ZEXT416((uint)subblock_mvs[lVar9]),0x60);
    dVar36 = (double)(auVar35._0_4_ >> 0x10);
    dVar37 = (double)(auVar35._4_4_ >> 0x10);
    dVar36 = SQRT(dVar37 * dVar37 + dVar36 * dVar36) / dVar34;
    if (dVar36 <= 1.0) {
      dVar36 = 1.0;
    }
    d_factor[lVar9] = dVar36;
  }
  uVar28 = (ulong)((uint)bVar2 * (uint)bVar3 * 4);
  __s = aom_memalign(0x10,uVar28);
  if (__s == (void *)0x0) {
    aom_internal_error(mbd->error_info,AOM_CODEC_MEM_ERROR,"Error allocating temporal filter data");
  }
  memset(__s,0,uVar28);
  __s_00 = aom_memalign(0x20,uVar28);
  if (__s_00 == (void *)0x0) {
    aom_free(__s);
    aom_internal_error(mbd->error_info,AOM_CODEC_MEM_ERROR,"Error allocating temporal filter data");
  }
  memset(__s_00,0,uVar28);
  uVar31 = 0;
  for (uVar28 = 0; uVar28 != uVar14; uVar28 = uVar28 + 1) {
    bVar11 = (byte)mbd->plane[uVar28].subsampling_y;
    bVar6 = bVar2 >> (bVar11 & 0x1f);
    uVar26 = (uint)bVar6;
    bVar16 = (byte)mbd->plane[uVar28].subsampling_x;
    bVar7 = bVar3 >> (bVar16 & 0x1f);
    uVar30 = (uint)bVar7;
    bVar11 = bVar11 - (char)mbd->plane[0].subsampling_y;
    bVar16 = bVar16 - (char)mbd->plane[0].subsampling_x;
    dVar34 = 0.04;
    if (uVar28 != 0) {
      dVar34 = 1.0 / (double)((1 << (bVar16 + bVar11 & 0x1f)) + 0x19);
    }
    iVar13 = *(int *)((long)frame_to_filter->store_buf_adr + (ulong)(uVar28 != 0) * 4 + -0x28);
    puVar5 = frame_to_filter->store_buf_adr[uVar28 - 4];
    uVar15 = (ulong)uVar30;
    if (uVar28 == 1) {
      iVar22 = 1 << (bVar11 & 0x1f);
      iVar24 = uVar30 << (bVar16 & 0x1f);
      uVar8 = 1 << (bVar16 & 0x1f);
      if (1 << (bVar16 & 0x1f) < 1) {
        uVar8 = 0;
      }
      if (1 << (bVar11 & 0x1f) < 1) {
        iVar22 = 0;
      }
      for (uVar19 = 0; uVar19 != uVar26; uVar19 = uVar19 + 1) {
        for (uVar29 = 0; uVar29 != uVar15; uVar29 = uVar29 + 1) {
          iVar20 = ((int)uVar29 << (bVar16 & 0x1f)) + ((int)uVar19 << (bVar11 & 0x1f)) * iVar24;
          for (iVar12 = 0; uVar23 = (ulong)uVar8, iVar18 = iVar20, iVar12 != iVar22;
              iVar12 = iVar12 + 1) {
            while (bVar32 = uVar23 != 0, uVar23 = uVar23 - 1, bVar32) {
              piVar1 = (int *)((long)__s_00 + uVar29 * 4 + uVar19 * uVar15 * 4);
              *piVar1 = *piVar1 + *(int *)((long)__s + (long)iVar18 * 4);
              iVar18 = iVar18 + 1;
            }
            iVar20 = iVar20 + iVar24;
          }
        }
      }
    }
    uVar19 = (ulong)uVar31;
    lVar9 = (long)(int)(uVar30 * mb_col + uVar26 * mb_row * iVar13);
    lVar27 = 0;
    iVar22 = 0;
    pvVar25 = __s;
    for (uVar8 = 0; uVar8 != uVar26; uVar8 = uVar8 + 1) {
      lVar27 = (long)(int)lVar27;
      for (uVar29 = 0; uVar15 != uVar29; uVar29 = uVar29 + 1) {
        if ((uVar4 & 8) == 0) {
          uVar17 = (ushort)puVar5[uVar29 + iVar22 + lVar9];
          uVar21 = (ushort)pred[uVar29 + lVar27 + uVar19];
        }
        else {
          uVar17 = *(ushort *)(lVar9 * 2 + (long)puVar5 * 2 + (long)iVar22 * 2 + uVar29 * 2);
          uVar21 = *(ushort *)((long)pred * 2 + uVar19 * 2 + lVar27 * 2 + uVar29 * 2);
        }
        iVar24 = (uint)uVar21 - (uint)uVar17;
        if (uVar21 < uVar17) {
          iVar24 = (uint)uVar17 - (uint)uVar21;
        }
        *(int *)((long)pvVar25 + uVar29 * 4) = iVar24 * iVar24;
      }
      iVar22 = iVar22 + (iVar13 - uVar30) + (int)uVar29;
      lVar27 = lVar27 + uVar29;
      pvVar25 = (void *)((long)pvVar25 + (ulong)(uVar30 * 4));
    }
    local_160 = 0;
    for (uVar29 = 0; uVar29 != uVar26; uVar29 = uVar29 + 1) {
      local_160 = (long)(int)local_160;
      for (uVar23 = 0; uVar23 != uVar15; uVar23 = uVar23 + 1) {
        lVar9 = 0;
        for (iVar13 = -2; iVar13 != 3; iVar13 = iVar13 + 1) {
          iVar24 = iVar13 + (int)uVar29;
          iVar22 = uVar26 - 1;
          if (iVar24 < (int)uVar26) {
            iVar22 = iVar24;
          }
          if (iVar24 < 0) {
            iVar22 = 0;
          }
          for (iVar24 = -2; iVar24 != 3; iVar24 = iVar24 + 1) {
            iVar20 = (int)uVar23 + iVar24;
            iVar12 = uVar30 - 1;
            if (iVar20 < (int)uVar30) {
              iVar12 = iVar20;
            }
            if (iVar20 < 0) {
              iVar12 = 0;
            }
            lVar9 = lVar9 + (ulong)*(uint *)((long)__s + (long)(int)(iVar12 + iVar22 * uVar30) * 4);
          }
        }
        bVar16 = (char)mbd->bd * '\x02' - 0x10;
        if (mbd->bd < 9) {
          bVar16 = 0;
        }
        uVar10 = lVar9 + (ulong)*(uint *)((long)__s_00 + uVar23 * 4 + uVar29 * uVar15 * 4) >>
                 (bVar16 & 0x3f);
        uVar8 = (uint)(bVar7 >> 1 <= uVar23) | (uint)(bVar6 >> 1 <= uVar29) * 2;
        auVar35._8_4_ = (int)(uVar10 >> 0x20);
        auVar35._0_8_ = uVar10;
        auVar35._12_4_ = 0x45300000;
        dVar36 = (((auVar35._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0)) * dVar34 *
                  0.041666666666666664 + (double)subblock_mses[uVar8] * 0.008333333333333333) *
                 d_factor[uVar8] * decay_factor[uVar28];
        if (7.0 <= dVar36) {
          dVar36 = 7.0;
        }
        if (tf_wgt_calc_lvl == 0) {
          dVar36 = exp(-dVar36);
          iVar13 = (int)(dVar36 * 1000.0);
        }
        else {
          iVar13 = (int)((float)((int)((float)dVar36 * -12102203.0) + 0x3f7f127f) * 1000.0 + 0.5);
        }
        lVar9 = uVar19 + local_160;
        if ((uVar4 & 8) == 0) {
          uVar8 = (uint)pred[lVar9];
        }
        else {
          uVar8 = (uint)*(ushort *)((long)pred * 2 + lVar9 * 2);
        }
        accum[lVar9] = accum[lVar9] + uVar8 * iVar13;
        count[lVar9] = count[lVar9] + (short)iVar13;
        local_160 = local_160 + 1;
      }
    }
    uVar31 = uVar30 * uVar26 + uVar31;
  }
  aom_free(__s);
  aom_free(__s_00);
  return;
}

Assistant:

void av1_apply_temporal_filter_c(
    const YV12_BUFFER_CONFIG *frame_to_filter, const MACROBLOCKD *mbd,
    const BLOCK_SIZE block_size, const int mb_row, const int mb_col,
    const int num_planes, const double *noise_levels, const MV *subblock_mvs,
    const int *subblock_mses, const int q_factor, const int filter_strength,
    int tf_wgt_calc_lvl, const uint8_t *pred, uint32_t *accum,
    uint16_t *count) {
  // Block information.
  const int mb_height = block_size_high[block_size];
  const int mb_width = block_size_wide[block_size];
  const int mb_pels = mb_height * mb_width;
  const int is_high_bitdepth = is_frame_high_bitdepth(frame_to_filter);
  const uint16_t *pred16 = CONVERT_TO_SHORTPTR(pred);
  // Frame information.
  const int frame_height = frame_to_filter->y_crop_height;
  const int frame_width = frame_to_filter->y_crop_width;
  const int min_frame_size = AOMMIN(frame_height, frame_width);
  // Variables to simplify combined error calculation.
  const double inv_factor = 1.0 / ((TF_WINDOW_BLOCK_BALANCE_WEIGHT + 1) *
                                   TF_SEARCH_ERROR_NORM_WEIGHT);
  const double weight_factor =
      (double)TF_WINDOW_BLOCK_BALANCE_WEIGHT * inv_factor;
  // Decay factors for non-local mean approach.
  double decay_factor[MAX_MB_PLANE] = { 0 };
  // Adjust filtering based on q.
  // Larger q -> stronger filtering -> larger weight.
  // Smaller q -> weaker filtering -> smaller weight.
  double q_decay = pow((double)q_factor / TF_Q_DECAY_THRESHOLD, 2);
  q_decay = CLIP(q_decay, 1e-5, 1);
  if (q_factor >= TF_QINDEX_CUTOFF) {
    // Max q_factor is 255, therefore the upper bound of q_decay is 8.
    // We do not need a clip here.
    q_decay = 0.5 * pow((double)q_factor / 64, 2);
  }
  // Smaller strength -> smaller filtering weight.
  double s_decay = pow((double)filter_strength / TF_STRENGTH_THRESHOLD, 2);
  s_decay = CLIP(s_decay, 1e-5, 1);
  for (int plane = 0; plane < num_planes; plane++) {
    // Larger noise -> larger filtering weight.
    const double n_decay = 0.5 + log(2 * noise_levels[plane] + 5.0);
    decay_factor[plane] = 1 / (n_decay * q_decay * s_decay);
  }
  double d_factor[4] = { 0 };
  for (int subblock_idx = 0; subblock_idx < 4; subblock_idx++) {
    // Larger motion vector -> smaller filtering weight.
    const MV mv = subblock_mvs[subblock_idx];
    const double distance = sqrt(pow(mv.row, 2) + pow(mv.col, 2));
    double distance_threshold = min_frame_size * TF_SEARCH_DISTANCE_THRESHOLD;
    distance_threshold = AOMMAX(distance_threshold, 1);
    d_factor[subblock_idx] = distance / distance_threshold;
    d_factor[subblock_idx] = AOMMAX(d_factor[subblock_idx], 1);
  }

  // Allocate memory for pixel-wise squared differences. They,
  // regardless of the subsampling, are assigned with memory of size `mb_pels`.
  uint32_t *square_diff = aom_memalign(16, mb_pels * sizeof(uint32_t));
  if (!square_diff) {
    aom_internal_error(mbd->error_info, AOM_CODEC_MEM_ERROR,
                       "Error allocating temporal filter data");
  }
  memset(square_diff, 0, mb_pels * sizeof(square_diff[0]));

  // Allocate memory for accumulated luma squared error. This value will be
  // consumed while filtering the chroma planes.
  uint32_t *luma_sse_sum = aom_memalign(32, mb_pels * sizeof(uint32_t));
  if (!luma_sse_sum) {
    aom_free(square_diff);
    aom_internal_error(mbd->error_info, AOM_CODEC_MEM_ERROR,
                       "Error allocating temporal filter data");
  }
  memset(luma_sse_sum, 0, mb_pels * sizeof(luma_sse_sum[0]));

  // Get window size for pixel-wise filtering.
  assert(TF_WINDOW_LENGTH % 2 == 1);
  const int half_window = TF_WINDOW_LENGTH >> 1;

  // Handle planes in sequence.
  int plane_offset = 0;
  for (int plane = 0; plane < num_planes; ++plane) {
    // Locate pixel on reference frame.
    const int subsampling_y = mbd->plane[plane].subsampling_y;
    const int subsampling_x = mbd->plane[plane].subsampling_x;
    const int h = mb_height >> subsampling_y;  // Plane height.
    const int w = mb_width >> subsampling_x;   // Plane width.
    const int frame_stride =
        frame_to_filter->strides[plane == AOM_PLANE_Y ? 0 : 1];
    const int frame_offset = mb_row * h * frame_stride + mb_col * w;
    const uint8_t *ref = frame_to_filter->buffers[plane];
    const int ss_y_shift =
        subsampling_y - mbd->plane[AOM_PLANE_Y].subsampling_y;
    const int ss_x_shift =
        subsampling_x - mbd->plane[AOM_PLANE_Y].subsampling_x;
    const int num_ref_pixels = TF_WINDOW_LENGTH * TF_WINDOW_LENGTH +
                               ((plane) ? (1 << (ss_x_shift + ss_y_shift)) : 0);
    const double inv_num_ref_pixels = 1.0 / num_ref_pixels;

    // Filter U-plane and V-plane using Y-plane. This is because motion
    // search is only done on Y-plane, so the information from Y-plane will
    // be more accurate. The luma sse sum is reused in both chroma planes.
    if (plane == AOM_PLANE_U)
      compute_luma_sq_error_sum(square_diff, luma_sse_sum, h, w, ss_x_shift,
                                ss_y_shift);
    compute_square_diff(ref, frame_offset, frame_stride, pred, plane_offset, w,
                        h, w, is_high_bitdepth, square_diff);

    // Perform filtering.
    int pred_idx = 0;
    for (int i = 0; i < h; ++i) {
      for (int j = 0; j < w; ++j) {
        // non-local mean approach
        uint64_t sum_square_diff = 0;

        for (int wi = -half_window; wi <= half_window; ++wi) {
          for (int wj = -half_window; wj <= half_window; ++wj) {
            const int y = CLIP(i + wi, 0, h - 1);  // Y-coord on current plane.
            const int x = CLIP(j + wj, 0, w - 1);  // X-coord on current plane.
            sum_square_diff += square_diff[y * w + x];
          }
        }

        sum_square_diff += luma_sse_sum[i * w + j];

        // Scale down the difference for high bit depth input.
        if (mbd->bd > 8) sum_square_diff >>= ((mbd->bd - 8) * 2);

        // Combine window error and block error, and normalize it.
        const double window_error = sum_square_diff * inv_num_ref_pixels;
        const int subblock_idx = (i >= h / 2) * 2 + (j >= w / 2);
        const double block_error = (double)subblock_mses[subblock_idx];
        const double combined_error =
            weight_factor * window_error + block_error * inv_factor;

        // Compute filter weight.
        double scaled_error =
            combined_error * d_factor[subblock_idx] * decay_factor[plane];
        scaled_error = AOMMIN(scaled_error, 7);
        int weight;
        if (tf_wgt_calc_lvl == 0) {
          weight = (int)(exp(-scaled_error) * TF_WEIGHT_SCALE);
        } else {
          const float fweight =
              approx_exp((float)-scaled_error) * TF_WEIGHT_SCALE;
          weight = iroundpf(fweight);
        }

        const int idx = plane_offset + pred_idx;  // Index with plane shift.
        const int pred_value = is_high_bitdepth ? pred16[idx] : pred[idx];
        accum[idx] += weight * pred_value;
        count[idx] += weight;

        ++pred_idx;
      }
    }
    plane_offset += h * w;
  }

  aom_free(square_diff);
  aom_free(luma_sse_sum);
}